

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

bool __thiscall
ON_LineCurve::Split(ON_LineCurve *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval *this_00;
  ON_LineCurve *pOVar1;
  double t_00;
  bool bVar2;
  ON_LineCurve *this_01;
  ON_LineCurve *this_02;
  char *sFormat;
  int iVar3;
  ON_Line right;
  ON_Line left;
  ON_Line local_b8;
  double local_88;
  double local_80;
  ON_Line local_78;
  ON_3dPoint local_48;
  
  this_00 = &this->m_t;
  bVar2 = ON_Interval::Includes(this_00,t,true);
  if (!bVar2) {
    return false;
  }
  iVar3 = this->m_dim;
  local_80 = ON_Interval::operator[](this_00,0);
  local_88 = ON_Interval::operator[](this_00,1);
  ON_Line::ON_Line(&local_78);
  ON_Line::ON_Line(&local_b8);
  local_78.from.z = (this->m_line).from.z;
  local_78.from.x = (this->m_line).from.x;
  local_78.from.y = (this->m_line).from.y;
  t_00 = ON_Interval::NormalizedParameterAt(this_00,t);
  ON_Line::PointAt(&local_48,&this->m_line,t_00);
  local_78.to.z = local_48.z;
  local_78.to.x = local_48.x;
  local_78.to.y = local_48.y;
  local_b8.from.x = local_48.x;
  local_b8.from.y = local_48.y;
  local_b8.from.z = local_48.z;
  local_b8.to.x = (this->m_line).to.x;
  local_b8.to.y = (this->m_line).to.y;
  local_b8.to.z = (this->m_line).to.z;
  bVar2 = ON_3dPoint::IsCoincident(&local_78.from,&local_78.to);
  if ((bVar2) || (bVar2 = ON_3dPoint::IsCoincident(&local_b8.from,&local_b8.to), bVar2)) {
    bVar2 = false;
  }
  else {
    pOVar1 = (ON_LineCurve *)*left_side;
    if (pOVar1 == (ON_LineCurve *)0x0) {
      this_01 = (ON_LineCurve *)0x0;
    }
    else {
      bVar2 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_LineCurve_class_rtti);
      this_01 = (ON_LineCurve *)0x0;
      if (bVar2) {
        this_01 = pOVar1;
      }
    }
    pOVar1 = (ON_LineCurve *)*right_side;
    if (pOVar1 == (ON_LineCurve *)0x0) {
      this_02 = (ON_LineCurve *)0x0;
    }
    else {
      bVar2 = ON_Object::IsKindOf((ON_Object *)pOVar1,&m_ON_LineCurve_class_rtti);
      this_02 = (ON_LineCurve *)0x0;
      if (bVar2) {
        this_02 = pOVar1;
      }
    }
    if ((this_01 == (ON_LineCurve *)0x0) && (*left_side != (ON_Curve *)0x0)) {
      sFormat = "ON_LineCurve::Split - input left_side not an ON_LineCurve*";
      iVar3 = 0x278;
    }
    else {
      if ((this_02 != (ON_LineCurve *)0x0) || (*right_side == (ON_Curve *)0x0)) {
        if (this_01 == (ON_LineCurve *)0x0) {
          this_01 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve(this_01);
          *left_side = (ON_Curve *)this_01;
        }
        if (this_02 == (ON_LineCurve *)0x0) {
          this_02 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve(this_02);
          *right_side = (ON_Curve *)this_02;
        }
        ON_Curve::DestroyCurveTree(&this_01->super_ON_Curve);
        (this_01->m_line).to.y = local_78.to.y;
        (this_01->m_line).to.z = local_78.to.z;
        (this_01->m_line).from.z = local_78.from.z;
        (this_01->m_line).to.x = local_78.to.x;
        (this_01->m_line).from.x = local_78.from.x;
        (this_01->m_line).from.y = local_78.from.y;
        ON_Interval::Set(&this_01->m_t,local_80,t);
        this_01->m_dim = iVar3;
        ON_Curve::DestroyCurveTree(&this_02->super_ON_Curve);
        (this_02->m_line).to.y = local_b8.to.y;
        (this_02->m_line).to.z = local_b8.to.z;
        (this_02->m_line).from.z = local_b8.from.z;
        (this_02->m_line).to.x = local_b8.to.x;
        (this_02->m_line).from.x = local_b8.from.x;
        (this_02->m_line).from.y = local_b8.from.y;
        ON_Interval::Set(&this_02->m_t,t,local_88);
        this_02->m_dim = iVar3;
        bVar2 = true;
        goto LAB_004cac42;
      }
      sFormat = "ON_LineCurve::Split - input right_side not an ON_LineCurve*";
      iVar3 = 0x27d;
    }
    bVar2 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linecurve.cpp"
               ,iVar3,"",sFormat);
  }
LAB_004cac42:
  ON_Line::~ON_Line(&local_b8);
  ON_Line::~ON_Line(&local_78);
  return bVar2;
}

Assistant:

bool ON_LineCurve::Split( 
      double t,
      ON_Curve*& left_side,
      ON_Curve*& right_side
    ) const

{
  bool rc = false;
  if ( m_t.Includes(t,true) )
  {
    const int dim = m_dim;
    double t0 = m_t[0];
    double t1 = m_t[1];
    ON_Line left, right;
    left.from = m_line.from;
    left.to = m_line.PointAt(m_t.NormalizedParameterAt(t));
    right.from = left.to;
    right.to = m_line.to;

		// 27 March 2003, Greg Arden.  Result must pass IsValid()
    // Fixes RH-64018
    // 6 May 21, GBA, changed ON_LineCurve::IsValid and so this was updated
		if( left.from.IsCoincident(left.to) || right.from.IsCoincident(right.to) )
			return false;

    ON_LineCurve* left_line = ON_LineCurve::Cast(left_side);
    ON_LineCurve* right_line = ON_LineCurve::Cast(right_side);
    if ( left_side && !left_line )
    {
      ON_ERROR("ON_LineCurve::Split - input left_side not an ON_LineCurve*");
      return false;
    }
    if ( right_side && !right_line )
    {
      ON_ERROR("ON_LineCurve::Split - input right_side not an ON_LineCurve*");
      return false;
    }
    if ( !left_line )
    {
      left_line = new ON_LineCurve();
      left_side = left_line;
    }
    if ( !right_line )
    {
      right_line = new ON_LineCurve();
      right_side = right_line;
    }

    left_line->DestroyCurveTree();
    left_line->m_line = left;
    left_line->m_t.Set( t0, t );
    left_line->m_dim = dim;

    right_line->DestroyCurveTree();
    right_line->m_line = right;
    right_line->m_t.Set( t, t1 );
    right_line->m_dim = dim;

    rc = true;
  }
  return rc;
}